

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O1

void luaJIT_profile_stop(lua_State *L)

{
  global_State *g;
  char *pcVar1;
  ulong uVar2;
  itimerval local_38;
  
  g = profile_state.g;
  if (profile_state.g == (global_State *)(L->glref).ptr64) {
    local_38.it_value.tv_sec = 0;
    local_38.it_value.tv_usec = 0;
    local_38.it_interval.tv_sec = 0;
    local_38.it_interval.tv_usec = 0;
    setitimer(ITIMER_PROF,&local_38,(itimerval *)0x0);
    sigaction(0x1b,(sigaction *)&profile_state.oldsa,(sigaction *)0x0);
    g->hookmask = g->hookmask & 0x7f;
    lj_dispatch_update(g);
    g[5].str.num = 0;
    lj_trace_flushall(L);
    pcVar1 = profile_state.sb.b;
    uVar2 = (ulong)(uint)((int)profile_state.sb.e - (int)profile_state.sb.b);
    (g->gc).total = (g->gc).total - uVar2;
    (*g->allocf)(g->allocd,pcVar1,uVar2,0);
    profile_state.g = (global_State *)0x0;
    profile_state.sb.w = (char *)0x0;
    profile_state.sb.e = (char *)0x0;
  }
  return;
}

Assistant:

LUA_API void luaJIT_profile_stop(lua_State *L)
{
  ProfileState *ps = &profile_state;
  global_State *g = ps->g;
  if (G(L) == g) {  /* Only stop profiler if started by this VM. */
    profile_timer_stop(ps);
    g->hookmask &= ~HOOK_PROFILE;
    lj_dispatch_update(g);
#if LJ_HASJIT
    G2J(g)->prof_mode = 0;
    lj_trace_flushall(L);
#endif
    lj_buf_free(g, &ps->sb);
    ps->sb.w = ps->sb.e = NULL;
    ps->g = NULL;
  }
}